

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O3

void CB_ADF::learn_SM(cb_adf *mydata,multi_learner *base,multi_ex *examples)

{
  label *cs_labels;
  action_scores *this;
  uint uVar1;
  wclass *pwVar2;
  example *peVar3;
  bool bVar4;
  bool bVar5;
  pointer ppeVar6;
  action_score *paVar7;
  float *pfVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  float local_d4;
  action_score local_c8;
  action_score *local_c0;
  label *local_b8;
  v_array<ACTION_SCORE::action_score> *local_b0;
  undefined1 local_a8 [16];
  v_array<CB::label> *local_90;
  v_array<COST_SENSITIVE::label> *local_88;
  multi_learner *local_80;
  double local_78;
  ulong local_70;
  v_array<unsigned_int> *local_68;
  pointer_____offset_0x10___ *local_60;
  action_score *local_58;
  pointer_____offset_0x10___ *local_50;
  action_score *local_48;
  pointer_____offset_0x10___ *local_40;
  action_score *local_38;
  
  cs_labels = &mydata->cs_labels;
  GEN_CS::gen_cs_test_example(examples,cs_labels);
  local_90 = &mydata->cb_labels;
  local_88 = &mydata->prepped_cs_labels;
  local_b8 = cs_labels;
  local_80 = base;
  GEN_CS::call_cs_ldf<false>(base,examples,local_90,cs_labels,local_88,mydata->offset,0);
  this = &mydata->a_s;
  v_array<ACTION_SCORE::action_score>::clear(this);
  local_b0 = &mydata->prob_s;
  v_array<ACTION_SCORE::action_score>::clear(local_b0);
  ppeVar6 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pfVar8 = ((*ppeVar6)->pred).scalars._begin;
  if (((*ppeVar6)->pred).scalars._end != pfVar8) {
    uVar10 = 1;
    uVar12 = 0;
    do {
      uVar13 = uVar10;
      local_c8.score = ((*ppeVar6)->pred).a_s._begin[uVar12].score;
      local_c8.action = (uint32_t)pfVar8[uVar12 * 2];
      v_array<ACTION_SCORE::action_score>::push_back(this,&local_c8);
      local_c8.score = 0.0;
      local_c8.action =
           (uint32_t)
           ((*(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start)->pred).scalars._begin[uVar12 * 2];
      v_array<ACTION_SCORE::action_score>::push_back(local_b0,&local_c8);
      ppeVar6 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pfVar8 = ((*ppeVar6)->pred).scalars._begin;
      uVar10 = (ulong)((int)uVar13 + 1);
      uVar12 = uVar13;
    } while (uVar13 < (ulong)((long)((*ppeVar6)->pred).scalars._end - (long)pfVar8 >> 3));
  }
  lVar9 = (long)(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)ppeVar6;
  local_d4 = 1.0;
  if (lVar9 != 0) {
    uVar10 = 0;
    do {
      pwVar2 = (ppeVar6[uVar10]->l).cs.costs._begin;
      if ((long)(ppeVar6[uVar10]->l).cs.costs._end - (long)pwVar2 == 0x10) {
        fVar14 = pwVar2->x;
        if ((fVar14 != 3.4028235e+38) || (NAN(fVar14))) {
          local_a8 = ZEXT416((uint)fVar14);
          local_d4 = GEN_CS::safe_probability(pwVar2->partial_prediction);
          bVar4 = pwVar2->x != 0.0;
          bVar5 = pwVar2->x <= 0.0;
          local_d4 = (float)local_a8._0_4_ / local_d4;
          if (bVar5 && bVar4) {
            local_d4 = -local_d4;
          }
          fVar14 = *(float *)(&DAT_00288480 + (ulong)(bVar5 && bVar4) * 4);
          goto LAB_00274468;
        }
      }
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (uVar10 < (ulong)(lVar9 >> 3));
  }
  uVar10 = 0;
  fVar14 = 1.0;
LAB_00274468:
  GEN_CS::gen_cs_example_sm(examples,(uint32_t)uVar10,fVar14,*this,local_b8);
  local_c0 = (mydata->a_s)._begin;
  local_38 = (mydata->a_s)._end;
  local_48 = (mydata->prob_s)._begin;
  local_58 = (mydata->prob_s)._end;
  local_c8 = (action_score)
             &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_40 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_50 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_60 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::generate_softmax<ACTION_SCORE::score_iterator,ACTION_SCORE::score_iterator>
            (0xbf800000);
  paVar7 = (mydata->prob_s)._begin;
  lVar9 = (long)(mydata->prob_s)._end - (long)paVar7;
  if (lVar9 != 0) {
    uVar11 = 1;
    uVar12 = 0;
    do {
      if (paVar7[uVar12].action == (uint32_t)uVar10) {
        local_d4 = local_d4 * paVar7[uVar12].score;
        break;
      }
      uVar12 = (ulong)uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar12 < (ulong)(lVar9 >> 3));
  }
  local_a8._0_8_ = &mydata->backup_weights;
  local_70 = uVar10;
  v_array<unsigned_int>::clear(&mydata->backup_weights);
  local_68 = &mydata->backup_nf;
  v_array<unsigned_int>::clear(local_68);
  paVar7 = (mydata->prob_s)._begin;
  if ((mydata->prob_s)._end != paVar7) {
    local_78 = (double)local_d4;
    uVar11 = 1;
    uVar10 = 0;
    do {
      uVar1 = paVar7[uVar10].action;
      local_c8.action =
           (uint32_t)
           (long)(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar1]->weight;
      v_array<unsigned_int>::push_back((v_array<unsigned_int> *)local_a8._0_8_,&local_c8.action);
      local_c8.action =
           (uint32_t)
           (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar1]->num_features;
      v_array<unsigned_int>::push_back(local_68,&local_c8.action);
      fVar14 = local_b0->_begin[uVar10].score;
      if (uVar1 == (uint)local_70) {
        fVar14 = (float)((1.0 - (double)fVar14) * local_78);
      }
      else {
        fVar14 = fVar14 * local_d4;
      }
      (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar1]->weight = fVar14;
      peVar3 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar1];
      if (peVar3->weight <= 1e-15) {
        peVar3->weight = 0.0;
      }
      uVar10 = (ulong)uVar11;
      paVar7 = (mydata->prob_s)._begin;
      uVar11 = uVar11 + 1;
    } while (uVar10 < (ulong)((long)(mydata->prob_s)._end - (long)paVar7 >> 3));
  }
  GEN_CS::call_cs_ldf<true>(local_80,examples,local_90,local_b8,local_88,mydata->offset,0);
  paVar7 = (mydata->prob_s)._begin;
  if ((mydata->prob_s)._end != paVar7) {
    uVar11 = 1;
    uVar10 = 0;
    do {
      uVar1 = paVar7[uVar10].action;
      (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar1]->weight =
           (float)(mydata->backup_weights)._begin[uVar10];
      (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar1]->num_features =
           (ulong)(mydata->backup_nf)._begin[uVar10];
      uVar10 = (ulong)uVar11;
      paVar7 = (mydata->prob_s)._begin;
      uVar11 = uVar11 + 1;
    } while (uVar10 < (ulong)((long)(mydata->prob_s)._end - (long)paVar7 >> 3));
  }
  return;
}

Assistant:

void learn_SM(cb_adf& mydata, multi_learner& base, multi_ex& examples) {
  gen_cs_test_example(examples, mydata.cs_labels);  // create test labels.
  call_cs_ldf<false>(base, examples, mydata.cb_labels, mydata.cs_labels, mydata.prepped_cs_labels, mydata.offset);

  // Can probably do this more efficiently than 6 loops over the examples...
  //[1: initialize temporary storage;
  // 2: find chosen action;
  // 3: create cs_labels (gen_cs_example_sm);
  // 4: get probability of chosen action;
  // 5: backup example wts;
  // 6: restore example wts]
  mydata.a_s.clear();
  mydata.prob_s.clear();
  // TODO: Check that predicted scores are always stored with the first example
  for (uint32_t i = 0; i < examples[0]->pred.a_s.size(); i++)
  {
    mydata.a_s.push_back({examples[0]->pred.a_s[i].action, examples[0]->pred.a_s[i].score});
    mydata.prob_s.push_back({examples[0]->pred.a_s[i].action, 0.0});
  }

  float sign_offset = 1.0;    // To account for negative rewards/costs
  uint32_t chosen_action = 0;
  float example_weight = 1.0;

  for (uint32_t i = 0; i < examples.size(); i++)
  {
    CB::label ld = examples[i]->l.cb;
    if (ld.costs.size() == 1 && ld.costs[0].cost != FLT_MAX)
    {
      chosen_action = i;
      example_weight = ld.costs[0].cost / safe_probability(ld.costs[0].probability);

      // Importance weights of examples cannot be negative.
      // So we use a trick: set |w| as weight, and use sign(w) as an offset in the regression target.
      if (ld.costs[0].cost < 0.0)
      {
        sign_offset = -1.0;
        example_weight = -example_weight;
      }
      break;
    }
  }

  gen_cs_example_sm(examples, chosen_action, sign_offset, mydata.a_s, mydata.cs_labels);

  // Lambda is -1 in the call to generate_softmax because in vw, lower score is better; for softmax higher score is better.
  generate_softmax(-1.0, begin_scores(mydata.a_s), end_scores(mydata.a_s), begin_scores(mydata.prob_s), end_scores(mydata.prob_s));

  // TODO: Check Marco's example that causes VW to report prob > 1.

  for (uint32_t i = 0; i < mydata.prob_s.size(); i++)  // Scale example_wt by prob of chosen action
  {
    if (mydata.prob_s[i].action == chosen_action)
    {
      example_weight *= mydata.prob_s[i].score;
      break;
    }
  }

  mydata.backup_weights.clear();
  mydata.backup_nf.clear();
    for (uint32_t i = 0; i < mydata.prob_s.size(); i++)
  {
    uint32_t current_action = mydata.prob_s[i].action;
    mydata.backup_weights.push_back(examples[current_action]->weight);
    mydata.backup_nf.push_back(examples[current_action]->num_features);

    if (current_action == chosen_action)
      examples[current_action]->weight = example_weight * (1.0 - mydata.prob_s[i].score);
    else
      examples[current_action]->weight = example_weight * mydata.prob_s[i].score;

    if (examples[current_action]->weight <= 1e-15)
      examples[current_action]->weight = 0;
  }

  //Do actual training
  call_cs_ldf<true>(base, examples, mydata.cb_labels, mydata.cs_labels, mydata.prepped_cs_labels, mydata.offset);

  //Restore example weights and numFeatures
  for (uint32_t i = 0; i < mydata.prob_s.size(); i++)
  {
    uint32_t current_action = mydata.prob_s[i].action;
    examples[current_action]->weight = mydata.backup_weights[i];
    examples[current_action]->num_features = mydata.backup_nf[i];
  }
}